

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O1

_Bool borg_offset_projectable(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  borg_grid *ag;
  uint uVar4;
  wchar_t x;
  wchar_t y;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t local_34;
  
  uVar4 = 0xffffffff;
  local_3c = x1;
  local_38 = y1;
  local_34 = x1;
  while( true ) {
    wVar2 = local_38;
    wVar1 = local_3c;
    ag = borg_grids[local_38] + local_3c;
    if ((uVar4 != 0xffffffff) && (ag->feat == '\0')) {
      return false;
    }
    if (ag->feat == '\x18') {
      return false;
    }
    if ((uVar4 != 0xffffffff) && (_Var3 = borg_cave_floor_grid(ag), !_Var3)) break;
    if (wVar2 == y2 && wVar1 == x2) {
      return true;
    }
    borg_inc_motion(&local_38,&local_3c,y1,local_34,y2,x2);
    uVar4 = uVar4 + 1;
    if (z_info->max_range <= uVar4) {
      return false;
    }
  }
  return false;
}

Assistant:

bool borg_offset_projectable(int y1, int x1, int y2, int x2)
{
    int dist, y, x;

    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Assume all unknown grids are walls. */
        if ((dist) && (ag->feat == FEAT_NONE))
            break;

        /* Never pass through rubble */
        if (ag->feat == FEAT_PASS_RUBBLE)
            break;

        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2))
            return true;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}